

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

IVec4 tcu::getFormatMinIntValue(TextureFormat *format)

{
  ChannelType CVar1;
  undefined8 in_RDX;
  undefined4 *in_RDI;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  IVec4 IVar6;
  
  CVar1 = format->type;
  if (CVar1 == SIGNED_INT8) {
    uVar2 = 0xffffff80;
    uVar3 = 0xffffff80;
    uVar4 = 0xffffff80;
    uVar5 = 0xffffff80;
  }
  else if (CVar1 == SIGNED_INT16) {
    uVar2 = 0xffff8000;
    uVar3 = 0xffff8000;
    uVar4 = 0xffff8000;
    uVar5 = 0xffff8000;
  }
  else if (CVar1 == SIGNED_INT32) {
    uVar2 = 0x80000000;
    uVar3 = 0x80000000;
    uVar4 = 0x80000000;
    uVar5 = 0x80000000;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
  }
  *in_RDI = uVar2;
  in_RDI[1] = uVar3;
  in_RDI[2] = uVar4;
  in_RDI[3] = uVar5;
  IVar6.m_data._8_8_ = in_RDX;
  IVar6.m_data._0_8_ = in_RDI;
  return (IVec4)IVar6.m_data;
}

Assistant:

IVec4 getFormatMinIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::min());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::min());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::min());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}